

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O3

int arkStep_SetNlsRhsFn(ARKodeMem ark_mem,ARKRhsFn nls_fi)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeARKStepMem local_10;
  
  iVar1 = arkStep_AccessStepMem(ark_mem,"arkStep_SetNlsRhsFn",&local_10);
  if (iVar1 == 0) {
    if (nls_fi == (ARKRhsFn)0x0) {
      nls_fi = local_10->fi;
    }
    local_10->nls_fi = nls_fi;
  }
  return iVar1;
}

Assistant:

int arkStep_SetNlsRhsFn(ARKodeMem ark_mem, ARKRhsFn nls_fi)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  if (nls_fi) { step_mem->nls_fi = nls_fi; }
  else { step_mem->nls_fi = step_mem->fi; }

  return (ARK_SUCCESS);
}